

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::FormatStrSS<std::__cxx11::stringstream,char[32],std::__cxx11::string,char>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [32],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs,
               char *RestArgs_1)

{
  char *RestArgs_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs_local;
  char (*FirstArg_local) [32];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[32]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,std::__cxx11::string,char>(ss,RestArgs,RestArgs_1);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}